

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Signature> *
wasm::WATParser::functype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Signature> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined1 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
  *params;
  _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
  *results;
  SignatureT SVar4;
  string_view expected;
  undefined1 local_e8 [8];
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> parsedParams;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  string local_a0;
  undefined1 local_80 [8];
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> parsedResults;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val_1;
  
  this = &ctx->in;
  expected._M_str = "func";
  expected._M_len = 4;
  bVar3 = Lexer::takeSExprStart(this,expected);
  if (bVar3) {
    params<wasm::WATParser::ParseTypeDefsCtx>
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               local_e8,ctx,true);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)local_80,
                      (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)local_e8);
    if (parsedResults.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
        '\x02') {
      puVar1 = (undefined1 *)
               ((long)&_val_1.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 8);
      parsedResults.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&parsedResults.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20),local_80,
                 parsedResults.val.
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
                 _0_8_ + (long)local_80);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> = puVar2;
      if ((undefined1 *)
          parsedResults.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ ==
          puVar1) {
        *puVar2 = CONCAT71(_val_1.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           _val_1.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x18) =
             _val_1.val.
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
             _16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> =
             parsedResults.val.
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> +
                  0x10) =
             CONCAT71(_val_1.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._9_7_,
                      _val_1.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      _M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 8) =
           _val_1.val.
           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x20) = '\x02'
      ;
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)local_80);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)local_80);
      results<wasm::WATParser::ParseTypeDefsCtx>
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)local_80,ctx)
      ;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)((long)&parsedResults.val.
                                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           + 0x20),
                        (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)local_80);
      if (_val_1.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_
          == '\x02') {
        parsedParams.val.
        super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._32_8_ =
             &local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&parsedParams.val.
                           super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                   + 0x20),parsedResults.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           ._32_8_,
                   _val_1.val.
                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u
                   ._0_8_ + parsedResults.val.
                            super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                            .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                            ._32_8_);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x10
                 );
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> = puVar2;
        if ((undefined8 *)
            parsedParams.val.
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._32_8_
            == &local_b0) {
          *puVar2 = local_b0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x18) =
               uStack_a8;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> =
               parsedParams.val.
               super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
               .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               _32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x10) =
               local_b0;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 8) =
             local_b8;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x20) =
             '\x02';
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)((long)&parsedResults.val.
                                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               + 0x20));
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)((long)&parsedResults.val.
                                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               + 0x20));
        bVar3 = Lexer::takeRParen(this);
        if (bVar3) {
          params = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                    *)local_e8;
          if (parsedParams.val.
              super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
              .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._M_u.
              _24_1_ != '\0') {
            params = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                      *)0x0;
          }
          results = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                     *)local_80;
          if (parsedResults.val.
              super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
              .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
              _24_1_ != '\0') {
            results = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)0x0;
          }
          SVar4 = TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeFuncType
                            (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                             (ParamsT *)params,(ResultsT *)results);
          *(SignatureT *)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> = SVar4;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x20) =
               '\0';
        }
        else {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"expected end of functype","");
          Lexer::err((Err *)((long)&parsedResults.val.
                                    super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                            + 0x20),this,&local_a0);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> +
                   0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> = puVar2;
          puVar1 = (undefined1 *)
                   ((long)&_val_1.val.
                           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                   8);
          if ((undefined1 *)
              parsedResults.val.
              super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
              .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ ==
              puVar1) {
            *puVar2 = CONCAT71(_val_1.val.
                               super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               ._M_u._9_7_,
                               _val_1.val.
                               super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               ._M_u._M_first._M_storage._M_storage[8]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x18) =
                 _val_1.val.
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
                 _16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> =
                 parsedResults.val.
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_
            ;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> +
                      0x10) =
                 CONCAT71(_val_1.val.
                          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                          ._M_u._9_7_,
                          _val_1.val.
                          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                          ._M_u._M_first._M_storage._M_storage[8]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 8) =
               _val_1.val.
               super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
               .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
               _0_8_;
          _val_1.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._0_8_ =
               0;
          _val_1.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._M_first
          ._M_storage._M_storage[8] = '\0';
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x20) =
               '\x02';
          parsedResults.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ =
               puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           *)local_80);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         *)local_e8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::SignatureT> functype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("func"sv)) {
    return {};
  }

  auto parsedParams = params(ctx);
  CHECK_ERR(parsedParams);

  auto parsedResults = results(ctx);
  CHECK_ERR(parsedResults);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of functype");
  }

  return ctx.makeFuncType(parsedParams.getPtr(), parsedResults.getPtr());
}